

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall
MainWindow::handleFocusChange(MainWindow *this,QWidget *oldWidget,QWidget *newWidget)

{
  bool bVar1;
  long lVar2;
  PianoWidget *pPVar3;
  QWidget *local_60;
  QWidget *local_50;
  QWidget *local_40;
  InstrumentEditor *local_30;
  QWidget *widget;
  IMidiReceiver *receiver;
  QWidget *newWidget_local;
  QWidget *oldWidget_local;
  MainWindow *this_local;
  
  bVar1 = Midi::isOpen(&this->mMidi);
  if ((bVar1) && (lVar2 = QApplication::activeModalWidget(), lVar2 == 0)) {
    local_40 = (QWidget *)0x0;
    if (this->mPatternEditor != (PatternEditor *)0x0) {
      local_40 = (QWidget *)&this->mPatternEditor->super_IMidiReceiver;
    }
    widget = local_40;
    for (local_30 = (InstrumentEditor *)newWidget; local_30 != (InstrumentEditor *)0x0;
        local_30 = (InstrumentEditor *)QWidget::parentWidget((QWidget *)local_30)) {
      if (local_30 == (InstrumentEditor *)this->mWaveEditor) {
        pPVar3 = BaseEditor::piano(&this->mWaveEditor->super_BaseEditor);
        local_50 = (QWidget *)0x0;
        if (pPVar3 != (PianoWidget *)0x0) {
          local_50 = (QWidget *)&pPVar3->super_IMidiReceiver;
        }
        widget = local_50;
        break;
      }
      if (local_30 == this->mInstrumentEditor) {
        pPVar3 = BaseEditor::piano(&this->mInstrumentEditor->super_BaseEditor);
        local_60 = (QWidget *)0x0;
        if (pPVar3 != (PianoWidget *)0x0) {
          local_60 = (QWidget *)&pPVar3->super_IMidiReceiver;
        }
        widget = local_60;
        break;
      }
    }
    Midi::setReceiver(&this->mMidi,(IMidiReceiver *)widget);
  }
  return;
}

Assistant:

void MainWindow::handleFocusChange(QWidget *oldWidget, QWidget *newWidget) {
    Q_UNUSED(oldWidget)

    // this handler is for determining where MIDI events will go, based on
    // who has focus. If MIDI is disabled we don't need to do anything

    // performance notes
    // searching is required by walking the newWidget's parents until either
    // nullptr or the editor dock widgets are found. Performance depends on
    // how deep newWidget is nested in the hierarchy.

    // alternative solution:
    // BaseEditor could have an eventFilter installed on all of its child widgets,
    // that check for FocusIn and FocusOut events, which we could emit a
    // signal for these and the MainWindow would handle them appropriately.

    if (mMidi.isOpen()) {
        if (QApplication::activeModalWidget()) {
            return; // ignore if a dialog is open
        }

        // MIDI events by default go to the pattern editor
        IMidiReceiver *receiver = mPatternEditor;

        QWidget *widget = newWidget;
        while (widget) {
            // search if this widget's parent is the instrument or waveform editor dock
            // if it is, midi events will go to the editor's piano widget
            if (widget == mWaveEditor) {
                receiver = mWaveEditor->piano();
                break;
            } else if (widget == mInstrumentEditor) {
                receiver = mInstrumentEditor->piano();
                break;
            }
            widget = widget->parentWidget();
        }
        mMidi.setReceiver(receiver);
    }

}